

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall cppcms::application::add_context(application *this,context *conn)

{
  application *paVar1;
  runtime_error *this_00;
  application *paVar2;
  _data *p_Var3;
  string local_40;
  
  paVar2 = this->root_;
  paVar1 = paVar2->root_;
  if (paVar2 != paVar1) {
    do {
      paVar2 = paVar1;
      this->root_ = paVar2;
      paVar1 = paVar2->root_;
    } while (paVar1 != paVar2);
  }
  p_Var3 = (paVar2->d).ptr_;
  if ((p_Var3->conn).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    if (paVar2 != paVar1) {
      do {
        paVar2 = paVar1;
        this->root_ = paVar2;
        paVar1 = paVar2->root_;
      } while (paVar2->root_ != paVar2);
      p_Var3 = (paVar2->d).ptr_;
    }
    p_Var3->temp_conn = conn;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Context already assigned","")
  ;
  booster::runtime_error::runtime_error(this_00,&local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00284840;
  (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

application *application::root()
{
	if(root_ == root_->root_)
		return root_;
	do {
		root_ = root_->root_;
	}
	while(root_->root_ != root_);
	return root_;
}